

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  int iVar1;
  long lVar2;
  sqlite3 *db_00;
  int N;
  int N_00;
  Mem *pMVar3;
  Mem **ppMVar4;
  VdbeCursor **ppVVar5;
  long in_RSI;
  Vdbe *in_RDI;
  long in_FS_OFFSET;
  int n;
  int nCursor;
  int nMem;
  int nVar;
  sqlite3 *db;
  ReusableSpace x;
  int nArg;
  bool local_51;
  int iVar6;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->pVList = *(VList **)(in_RSI + 0x148);
  *(undefined8 *)(in_RSI + 0x148) = 0;
  db_00 = in_RDI->db;
  N = (int)*(short *)(in_RSI + 0x130);
  iVar6 = *(int *)(in_RSI + 0x38);
  iVar1 = *(int *)(in_RSI + 0x90);
  N_00 = iVar6 + *(int *)(in_RSI + 0x3c);
  if ((iVar6 == 0) && (0 < N_00)) {
    N_00 = N_00 + 1;
  }
  resolveP2Values((Vdbe *)(long)(int)(*(int *)(in_RSI + 0x40) + in_RDI->nOp * -0x18 & 0xfffffff8),
                  (int *)(&in_RDI->aOp->opcode + in_RDI->nOp * 0x18));
  local_51 = false;
  if (*(char *)(in_RSI + 0x20) != '\0') {
    local_51 = *(char *)(in_RSI + 0x21) != '\0';
  }
  *(ushort *)&in_RDI->field_0xc8 = *(ushort *)&in_RDI->field_0xc8 & 0xffdf | (ushort)local_51 << 5;
  if (*(char *)(in_RSI + 0x133) != '\0') {
    if (N_00 < 10) {
      N_00 = 10;
    }
    *(ushort *)&in_RDI->field_0xc8 =
         *(ushort *)&in_RDI->field_0xc8 & 0xfff3 | (*(byte *)(in_RSI + 0x133) & 3) << 2;
    in_RDI->nResColumn = (*(ushort *)&in_RDI->field_0xc8 >> 2 & 3) * -4 + 0xc;
  }
  *(ushort *)&in_RDI->field_0xc8 = *(ushort *)&in_RDI->field_0xc8 & 0xfffc;
  pMVar3 = (Mem *)allocSpace((ReusableSpace *)&stack0xffffffffffffffd8,(void *)0x0,(long)N_00 * 0x38
                            );
  in_RDI->aMem = pMVar3;
  pMVar3 = (Mem *)allocSpace((ReusableSpace *)&stack0xffffffffffffffd8,(void *)0x0,(long)N * 0x38);
  in_RDI->aVar = pMVar3;
  ppMVar4 = (Mem **)allocSpace((ReusableSpace *)&stack0xffffffffffffffd8,(void *)0x0,
                               (long)iVar1 << 3);
  in_RDI->apArg = ppMVar4;
  ppVVar5 = (VdbeCursor **)
            allocSpace((ReusableSpace *)&stack0xffffffffffffffd8,(void *)0x0,(long)iVar6 << 3);
  in_RDI->apCsr = ppVVar5;
  if (db_00->mallocFailed == '\0') {
    in_RDI->nCursor = iVar6;
    in_RDI->nVar = (ynVar)N;
    initMemArray(in_RDI->aVar,N,db_00,1);
    in_RDI->nMem = N_00;
    initMemArray(in_RDI->aMem,N_00,db_00,0);
    memset(in_RDI->apCsr,0,(long)iVar6 << 3);
  }
  else {
    in_RDI->nVar = 0;
    in_RDI->nCursor = 0;
    in_RDI->nMem = 0;
  }
  sqlite3VdbeRewind(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  assert( pParse->db==p->db );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    p->nResColumn = 12 - 4*p->explain;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
  }
  sqlite3VdbeRewind(p);
}